

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_user_agent.cpp
# Opt level: O2

void duckdb::PragmaUserAgentFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  string sStack_78;
  Value local_58;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  if (*(char *)&pGVar1[5]._vptr_GlobalTableFunctionState == '\0') {
    output->count = 1;
    ::std::__cxx11::string::string((string *)&sStack_78,(string *)(pGVar1 + 1));
    Value::Value(&local_58,&sStack_78);
    DataChunk::SetValue(output,0,0,&local_58);
    Value::~Value(&local_58);
    ::std::__cxx11::string::~string((string *)&sStack_78);
    *(undefined1 *)&pGVar1[5]._vptr_GlobalTableFunctionState = 1;
  }
  return;
}

Assistant:

void PragmaUserAgentFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<PragmaUserAgentData>();

	if (data.finished) {
		// signal end of output
		return;
	}

	output.SetCardinality(1);
	output.SetValue(0, 0, data.user_agent);

	data.finished = true;
}